

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

Var __thiscall Gluco::Solver::newVar(Solver *this,bool sign,bool dvar)

{
  double local_98;
  byte local_49;
  uint local_48;
  char local_41;
  double local_40;
  VarData local_34;
  lbool local_29;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  byte local_12;
  byte local_11;
  int v;
  bool dvar_local;
  bool sign_local;
  Solver *this_local;
  
  local_12 = dvar;
  local_11 = sign;
  _v = this;
  local_18 = nVars(this);
  local_1c = (int)mkLit(local_18,false);
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::init
            (&this->watches,(EVP_PKEY_CTX *)&local_1c);
  local_20 = (int)mkLit(local_18,true);
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::init
            (&this->watches,(EVP_PKEY_CTX *)&local_20);
  local_24 = (int)mkLit(local_18,false);
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::init
            (&this->watchesBin,(EVP_PKEY_CTX *)&local_24);
  local_28 = (int)mkLit(local_18,true);
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::init
            (&this->watchesBin,(EVP_PKEY_CTX *)&local_28);
  lbool::lbool(&local_29,'\x02');
  vec<Gluco::lbool>::push(&this->assigns,&local_29);
  local_34 = mkVarData(0xffffffff,0);
  vec<Gluco::Solver::VarData>::push(&this->vardata,&local_34);
  if ((this->rnd_init_act & 1U) == 0) {
    local_98 = 0.0;
  }
  else {
    local_98 = drand(&this->random_seed);
    local_98 = local_98 * 1e-05;
  }
  local_40 = local_98;
  vec<double>::push(&this->activity,&local_40);
  local_41 = '\0';
  vec<char>::push(&this->seen,&local_41);
  local_48 = 0;
  vec<unsigned_int>::push(&this->permDiff,&local_48);
  local_49 = local_11 & 1;
  vec<char>::push(&this->polarity,(char *)&local_49);
  vec<char>::push(&this->decision);
  vec<Gluco::Lit>::capacity(&this->trail,local_18 + 1);
  setDecisionVar(this,local_18,(bool)(local_12 & 1));
  return local_18;
}

Assistant:

Var Solver::newVar(bool sign, bool dvar)
{
    int v = nVars();
    watches  .init(mkLit(v, false));
    watches  .init(mkLit(v, true ));
    watchesBin  .init(mkLit(v, false));
    watchesBin  .init(mkLit(v, true ));
    assigns  .push(l_Undef);
    vardata  .push(mkVarData(CRef_Undef, 0));
    //activity .push(0);
    activity .push(rnd_init_act ? drand(random_seed) * 0.00001 : 0);
    seen     .push(0);
    permDiff .push(0);
    polarity .push(sign);
    decision .push();
    trail    .capacity(v+1);
    setDecisionVar(v, dvar);
    return v;
}